

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join.h
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
ezy::
join<std::__cxx11::string,ezy::detail::range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,ezy::detail::reverse_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,int[4]>>>,ezy::to_string_fn_const&>,std::basic_string_view<char,std::char_traits<char>>&>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,ezy *this,
          range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_ezy::detail::reverse_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_int[4]>_>_>,_const_ezy::to_string_fn_&>
          *range,basic_string_view<char,_std::char_traits<char>_> *separator)

{
  anon_class_24_2_e8cc7173 __f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *result;
  to_string_fn *in_R8;
  iterator_adaptor<std::reverse_iterator<const_int_*>,_const_ezy::to_string_fn_&> __last;
  iterator_adaptor<std::reverse_iterator<const_int_*>,_const_ezy::to_string_fn_&> __first;
  anon_class_24_2_e8cc7173 local_50;
  long local_38;
  reverse_iterator<const_int_*> local_30;
  long local_28;
  reverse_iterator<const_int_*> local_20;
  
  local_50.separator._M_len = *(size_t *)(this + 8);
  local_50.result =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(**(long **)this + 0x10)
  ;
  detail::iterator_adaptor<std::reverse_iterator<int_const*>,ezy::to_string_fn_const&>::
  operator*[abi_cxx11_(__return_storage_ptr__,&local_50);
  local_30.current = *(int **)(this + 8);
  local_38 = **(long **)this;
  local_28 = local_38 + 0xc;
  __f.separator._M_len = (size_t)(range->orig_range).t;
  __f.result = __return_storage_ptr__;
  __f.separator._M_str = (char *)range->transformation;
  __last.converter = in_R8;
  __last.super_basic_iterator_adaptor<std::reverse_iterator<const_int_*>_>.orig.current =
       (reverse_iterator<const_int_*>)(reverse_iterator<const_int_*>)local_30.current;
  __first.converter = (to_string_fn *)&local_38;
  __first.super_basic_iterator_adaptor<std::reverse_iterator<const_int_*>_>.orig.current =
       (reverse_iterator<const_int_*>)(reverse_iterator<const_int_*>)&local_28;
  local_20.current = local_30.current;
  std::
  for_each<ezy::detail::iterator_adaptor<std::reverse_iterator<int_const*>,ezy::to_string_fn_const&>,ezy::join<std::__cxx11::string,ezy::detail::range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,ezy::detail::reverse_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,int[4]>>>,ezy::to_string_fn_const&>,std::basic_string_view<char,std::char_traits<char>>&>(ezy::detail::range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,ezy::detail::reverse_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,int[4]>>>,ezy::to_string_fn_const&>&&,std::basic_string_view<char,std::char_traits<char>>&)::_lambda(auto:1_const&)_1_>
            (&local_50,__first,__last,__f);
  return __return_storage_ptr__;
}

Assistant:

constexpr ReturnType join(Range&& range, Separator&& separator = Separator{})
  {
    using std::begin;
    using std::end;
    if (ezy::empty(range))
    {
      return ReturnType{};
    }
    else
    {
      ReturnType result{*begin(range)};
      std::for_each(
          std::next(begin(range)),
          end(range),
          [&result,separator](const auto& e)
          {
            result += separator;
            result += e;
          }
        );
      return result;
    }
  }